

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O3

float closest_point_ray_circle(vec3 ro,vec3 rd,vec3 cc,vec3 cn,float cr,float *s,vec3 *c1,vec3 *c2)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  _Bool _Var4;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar5;
  float fVar7;
  undefined1 auVar6 [16];
  float fVar8;
  float fVar9;
  undefined4 in_XMM2_Dc;
  undefined4 in_XMM2_Dd;
  float fVar10;
  undefined4 in_XMM4_Dc;
  undefined4 in_XMM4_Dd;
  float fVar11;
  float t;
  int idx;
  float local_70;
  int local_6c;
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [8];
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [8];
  float fStack_40;
  float fStack_3c;
  vec3 local_38;
  vec3 local_28;
  
  local_38.z = cn.z;
  local_38._0_8_ = cn._0_8_;
  fVar9 = cc.z;
  local_28._0_8_ = cc._0_8_;
  fStack_40 = (float)in_XMM4_Dc;
  local_48._0_4_ = local_28.x;
  local_48._4_4_ = local_28.y;
  fStack_3c = (float)in_XMM4_Dd;
  fStack_50 = (float)in_XMM0_Dc;
  local_58 = ro._0_8_;
  fStack_4c = (float)in_XMM0_Dd;
  fStack_60 = (float)in_XMM2_Dc;
  local_68 = rd._0_8_;
  fStack_5c = (float)in_XMM2_Dd;
  local_28.z = fVar9;
  _Var4 = ray_intersect_planes(ro,rd,&local_28,&local_38,1,&local_70,&local_6c);
  if (_Var4) {
    *s = local_70;
    fVar11 = rd.z * local_70 + ro.z;
    c1->z = fVar11;
    fVar5 = local_70 * (float)local_68._0_4_ + (float)local_58._0_4_;
    fVar7 = local_70 * (float)local_68._4_4_ + (float)local_58._4_4_;
    c1->x = fVar5;
    c1->y = fVar7;
    auVar6._0_4_ = fVar5 - (float)local_48._0_4_;
    auVar6._4_4_ = fVar7 - (float)local_48._4_4_;
    auVar6._8_4_ = (local_70 * fStack_60 + fStack_50) - fStack_40;
    auVar6._12_4_ = (local_70 * fStack_5c + fStack_4c) - fStack_3c;
    fVar11 = fVar11 - fVar9;
    fVar10 = SQRT(fVar11 * fVar11 + auVar6._0_4_ * auVar6._0_4_ + auVar6._4_4_ * auVar6._4_4_);
    fVar8 = 0.0;
    fVar5 = 0.0;
    fVar7 = 0.0;
    if ((fVar10 != 0.0) || (NAN(fVar10))) {
      fVar8 = fVar11 / fVar10;
      auVar3._4_4_ = fVar10;
      auVar3._0_4_ = fVar10;
      auVar3._8_4_ = fVar10;
      auVar3._12_4_ = fVar10;
      auVar6 = divps(auVar6,auVar3);
      fVar5 = auVar6._0_4_;
      fVar7 = auVar6._4_4_;
    }
    fVar5 = cr * fVar5 + (float)local_48._0_4_;
    fVar7 = cr * fVar7 + (float)local_48._4_4_;
    fVar9 = fVar8 * cr + fVar9;
    c2->x = fVar5;
    c2->y = fVar7;
    c2->z = fVar9;
    uVar1 = c1->x;
    uVar2 = c1->y;
    fVar5 = (float)uVar1 - fVar5;
    fVar7 = (float)uVar2 - fVar7;
    fVar9 = c1->z - fVar9;
    fVar9 = SQRT(fVar9 * fVar9 + fVar5 * fVar5 + fVar7 * fVar7);
  }
  else {
    *s = 3.4028235e+38;
    c1->x = 3.4028235e+38;
    c1->y = 3.4028235e+38;
    c1->z = 3.4028235e+38;
    c2->x = 3.4028235e+38;
    c2->y = 3.4028235e+38;
    c2->z = 3.4028235e+38;
    fVar9 = 3.4028235e+38;
  }
  return fVar9;
}

Assistant:

float closest_point_ray_circle(vec3 ro, vec3 rd, vec3 cc, vec3 cn, float cr, float *s, vec3 *c1, vec3 *c2) {
    float t;
    int idx;
    if (ray_intersect_planes(ro, rd, &cc, &cn, 1, &t, &idx)) {
        *s = t;
        *c1 = vec3_add(ro, vec3_scale(rd, t));    
        *c2 = vec3_add(cc, vec3_set_length(vec3_subtract(*c1, cc), cr));
        return vec3_distance(*c1, *c2);
    } else {
        // This is wrong, but probably doesn't matter...
        *s = FLT_MAX;
        *c1 = V3(FLT_MAX, FLT_MAX, FLT_MAX);
        *c2 = V3(FLT_MAX, FLT_MAX, FLT_MAX);
        return FLT_MAX;
    }
}